

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborValueRef __thiscall QCborValue::operator[](QCborValue *this,QString *key)

{
  QStringView QVar1;
  QCborValueConstRef QVar2;
  undefined8 local_30;
  QStringView in_stack_fffffffffffffff0;
  
  QVar1 = qToStringViewIgnoringNull<QString,_true>(local_30);
  QVar2 = (QCborValueConstRef)
          QCborContainerPrivate::findOrAddMapKey<QStringView>
                    ((QCborValue *)QVar1.m_data,in_stack_fffffffffffffff0);
  return (QCborValueRef)QVar2;
}

Assistant:

QCborValueRef QCborValue::operator[](const QString &key)
{
    return QCborContainerPrivate::findOrAddMapKey(*this, qToStringViewIgnoringNull(key));
}